

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O1

int luaB_tonumber(lua_State *L)

{
  char cVar1;
  byte bVar2;
  ushort *puVar3;
  int iVar4;
  lua_Integer lVar5;
  char *pcVar6;
  size_t sVar7;
  ushort **ppuVar8;
  byte *pbVar9;
  __int32_t **pp_Var10;
  size_t sVar11;
  byte *__s;
  undefined8 unaff_R13;
  long lVar12;
  size_t l;
  lua_Integer local_58;
  size_t local_50;
  char *local_48;
  lua_State *local_40;
  undefined8 local_38;
  
  iVar4 = lua_type(L,2);
  if (iVar4 < 1) {
    luaL_checkany(L,1);
    iVar4 = lua_type(L,1);
    if (iVar4 == 3) {
      lua_settop(L,1);
      return 1;
    }
    pcVar6 = lua_tolstring(L,1,&local_50);
    if ((pcVar6 != (char *)0x0) && (sVar11 = lua_stringtonumber(L,pcVar6), sVar11 == local_50 + 1))
    {
      return 1;
    }
  }
  else {
    lVar5 = luaL_checkinteger(L,2);
    luaL_checktype(L,1,4);
    pcVar6 = lua_tolstring(L,1,&local_50);
    if (0x22 < lVar5 - 2U) {
      luaL_argerror(L,2,"base out of range");
    }
    sVar7 = strspn(pcVar6," \f\n\r\t\v");
    cVar1 = pcVar6[sVar7];
    __s = (byte *)(pcVar6 + ((cVar1 - 0x2bU & 0xfd) == 0) + sVar7);
    ppuVar8 = __ctype_b_loc();
    puVar3 = *ppuVar8;
    local_58 = 0;
    pbVar9 = (byte *)0x0;
    if ((puVar3[*__s] & 8) != 0) {
      local_58 = 0;
      lVar12 = 0;
      local_48 = pcVar6;
      local_40 = L;
      local_38 = CONCAT71((int7)((ulong)unaff_R13 >> 8),cVar1);
      do {
        bVar2 = *__s;
        if ((*(byte *)((long)puVar3 + (ulong)bVar2 * 2 + 1) & 8) == 0) {
          pp_Var10 = __ctype_toupper_loc();
          iVar4 = (*pp_Var10)[bVar2] + -0x37;
        }
        else {
          iVar4 = (char)bVar2 + -0x30;
        }
        if ((int)lVar5 <= iVar4) {
          pbVar9 = (byte *)0x0;
          L = local_40;
          pcVar6 = local_48;
          goto LAB_00125b7b;
        }
        lVar12 = (long)iVar4 + lVar12 * (int)lVar5;
        pbVar9 = __s + 1;
        __s = __s + 1;
      } while ((puVar3[*pbVar9] & 8) != 0);
      sVar7 = strspn((char *)__s," \f\n\r\t\v");
      pbVar9 = __s + sVar7;
      L = local_40;
      pcVar6 = local_48;
      local_58 = -lVar12;
      if ((char)local_38 != '-') {
        local_58 = lVar12;
      }
    }
LAB_00125b7b:
    if (pbVar9 == (byte *)(pcVar6 + local_50)) {
      lua_pushinteger(L,local_58);
      return 1;
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int luaB_tonumber (lua_State *L) {
  if (lua_isnoneornil(L, 2)) {  /* standard conversion? */
    luaL_checkany(L, 1);
    if (lua_type(L, 1) == LUA_TNUMBER) {  /* already a number? */
      lua_settop(L, 1);  /* yes; return it */
      return 1;
    }
    else {
      size_t l;
      const char *s = lua_tolstring(L, 1, &l);
      if (s != NULL && lua_stringtonumber(L, s) == l + 1)
        return 1;  /* successful conversion to number */
      /* else not a number */
    }
  }
  else {
    size_t l;
    const char *s;
    lua_Integer n = 0;  /* to avoid warnings */
    lua_Integer base = luaL_checkinteger(L, 2);
    luaL_checktype(L, 1, LUA_TSTRING);  /* no numbers as strings */
    s = lua_tolstring(L, 1, &l);
    luaL_argcheck(L, 2 <= base && base <= 36, 2, "base out of range");
    if (b_str2int(s, (int)base, &n) == s + l) {
      lua_pushinteger(L, n);
      return 1;
    }  /* else not a number */
  }  /* else not a number */
  lua_pushnil(L);  /* not a number */
  return 1;
}